

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

void __thiscall Polymer::LogUncover(Polymer *this,string *species_name)

{
  const_iterator cVar1;
  mapped_type_conflict *pmVar2;
  SpeciesTracker *this_00;
  mapped_type_conflict mVar3;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->uncovered_)._M_t,species_name);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->uncovered_,species_name);
  mVar3 = *pmVar2 + 1;
  if ((_Rb_tree_header *)cVar1._M_node == &(this->uncovered_)._M_t._M_impl.super__Rb_tree_header) {
    mVar3 = 1;
  }
  *pmVar2 = mVar3;
  this_00 = SpeciesTracker::Instance();
  SpeciesTracker::Increment(this_00,species_name,1);
  return;
}

Assistant:

void Polymer::LogUncover(const std::string &species_name) {
  if (uncovered_.count(species_name) == 0) {
    uncovered_[species_name] = 1;
  } else {
    uncovered_[species_name]++;
  }
  SpeciesTracker::Instance().Increment(species_name, 1);
}